

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>_&,_const_trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>_&>
::streamReconstructedExpression
          (BinaryExpr<const_trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>_&,_const_trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *in_RDX;
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *value;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  StringMaker<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>,void>::
  convert<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>>
            (&local_40,
             (StringMaker<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>,void> *)this->m_lhs,
             in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>,void>::
  convert<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>>
            (&local_60,
             (StringMaker<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>,void> *)this->m_rhs,
             value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }